

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  event *peVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  event_base *base;
  long lVar6;
  char *pcVar7;
  int line;
  char *fmt;
  long lVar8;
  event *terminators [2];
  _union_1457 local_c8;
  undefined1 local_c0 [128];
  undefined4 local_40;
  
  argp_parse(&arg_def,argc,argv,0,0,&prog_arg);
  _Var2 = cfg_loadf(prog_arg.config_file,app_cfg_items);
  iVar5 = -1;
  if (!_Var2) {
    return -1;
  }
  _Var2 = cdns_validate_cfg();
  if (!_Var2) {
    return -1;
  }
  iVar3 = log_preopen("cdns",g_app_cfg.log,g_app_cfg.log_debug,g_app_cfg.log_info);
  if (iVar3 != 0) {
    fwrite("Failed to set up logging.\n",0x1a,1,_stderr);
    return -1;
  }
  log_open();
  if ((g_app_cfg.daemon == true) && (iVar3 = daemon(1,0), iVar3 != 0)) {
    pcVar7 = "main";
    fmt = "daemon";
    iVar3 = 1;
    line = 0xa0;
  }
  else {
    pcVar7 = g_app_cfg.pidfile;
    if (g_app_cfg.pidfile != (char *)0x0) {
      __stream = fopen(g_app_cfg.pidfile,"w");
      if (__stream == (FILE *)0x0) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",
                   0x114,"write_pidfile",0,4,"Unable to open pidfile for write: %s",pcVar7);
      }
      else {
        uVar4 = getpid();
        fprintf(__stream,"%d\n",(ulong)uVar4);
        fclose(__stream);
      }
    }
    base = (event_base *)event_base_new();
    if (base != (event_base *)0x0) {
      terminators[0] = (event *)0x0;
      terminators[1] = (event *)0x0;
      lVar8 = 0;
      do {
        if (lVar8 == 8) {
          memset(local_c0,0,0x90);
          local_c8 = (_union_1457)0x1;
          local_40 = 0x10000000;
          iVar5 = sigaction(0xd,(sigaction *)&local_c8,(sigaction *)0x0);
          if (iVar5 == -1) goto LAB_001037fe;
          lVar8 = event_new(base,10,0x18,sigusr1_handler,0);
          if (lVar8 == 0) {
            pcVar7 = "evsignal_new";
            iVar5 = 0xdd;
            goto LAB_001037f7;
          }
          iVar5 = event_add(lVar8,0);
          if (iVar5 == 0) {
            iVar5 = cdns_init_server(base);
            if (iVar5 != 0) {
              return 0;
            }
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c"
                       ,0x108,"start_server",0,6,"%s started","cdns");
            event_base_dispatch(base);
            event_base_free(base);
            return 0;
          }
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",
                     0xe1,"init_signal_handlers",1,3,"evsignal_add");
          iVar5 = event_del(lVar8);
          if (iVar5 != 0) {
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c"
                       ,0xea,"init_signal_handlers",1,4,"evsignal_del");
          }
          event_free(lVar8);
          goto LAB_001037fe;
        }
        lVar6 = event_new(base,*(undefined4 *)((long)&DAT_00108228 + lVar8),0x18,terminate,base);
        *(long *)((long)terminators + lVar8 * 2) = lVar6;
        if (lVar6 == 0) {
          pcVar7 = "evsignal_new";
          iVar5 = 0xcb;
          goto LAB_001037f7;
        }
        iVar5 = event_add(lVar6);
        lVar8 = lVar8 + 4;
      } while (iVar5 == 0);
      pcVar7 = "evsignal_add";
      iVar5 = 0xcf;
LAB_001037f7:
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",iVar5
                 ,"init_signal_handlers",1,3,pcVar7);
LAB_001037fe:
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        peVar1 = terminators[lVar8];
        if (peVar1 != (event *)0x0) {
          iVar5 = event_del(peVar1);
          if (iVar5 != 0) {
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c"
                       ,0xf1,"init_signal_handlers",1,4,"evsignal_del");
          }
          event_free(peVar1);
        }
      }
      return 0;
    }
    pcVar7 = "start_server";
    fmt = "Unable to initialize libevent base";
    iVar5 = 0;
    line = 0xff;
    iVar3 = 0;
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",line,
             pcVar7,iVar3,3,fmt);
  return iVar5;
}

Assistant:

int main (int argc, char * argv[])
{
    /* Handle arguments */
    argp_parse (&arg_def, argc, argv, 0, 0, &prog_arg);

    /* init globals */
    init_global_cfg();

    /* Load configurations */
    if (!cfg_loadf(prog_arg.config_file, &app_cfg_items[0]))
        return -1;

    /* Verify configurations */
    if (!cdns_validate_cfg())
        return -1;

    /* Setup logging */
    if (log_preopen("cdns", g_app_cfg.log, g_app_cfg.log_debug, g_app_cfg.log_info)) {
        fprintf(stderr, "Failed to set up logging.\n");
        return -1; 
    } 
    log_open();

    if (g_app_cfg.daemon) {
        if (daemon(1, 0)) {
            log_errno(LOG_ERR, "daemon");
            return -1;
        }
    }
    if (g_app_cfg.pidfile)
        write_pidfile(g_app_cfg.pidfile);
        
    /* Start serving */    
    start_server(); 

    /* Clean up before exit */
    return 0;
}